

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.h
# Opt level: O2

void __thiscall trieste::PassDef::compile_rules(PassDef *this)

{
  DefaultMap<trieste::detail::DefaultMap<std::vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>_>_>
  *this_00;
  pointer ppVar1;
  DefaultMap<std::vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>_>
  *rules;
  _Base_ptr p_Var2;
  pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>
  *rule;
  pointer ppVar3;
  anon_class_16_2_a97d8124 f;
  anon_class_16_2_a97d8124 add;
  anon_class_16_2_a97d8124 local_40;
  
  this_00 = &this->rule_map;
  detail::
  DefaultMap<trieste::detail::DefaultMap<std::vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>_>_>
  ::clear(this_00);
  ppVar1 = (this->rules_).
           super__Vector_base<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar3 = (this->rules_).
                super__Vector_base<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar3 != ppVar1; ppVar3 = ppVar3 + 1) {
    local_40.starts =
         (set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_> *)
         &(ppVar3->first).value.fast_pattern;
    local_40.rule =
         (pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>
          *)ppVar3;
    if (*(size_t *)
         ((long)&(ppVar3->first).value.fast_pattern.parents._M_t._M_impl.super__Rb_tree_header +
         0x20) == 0) {
      f.rule = (pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>
                *)ppVar3;
      f.starts = local_40.starts;
      detail::
      DefaultMap<trieste::detail::DefaultMap<std::vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,std::function<std::shared_ptr<trieste::NodeDef>(trieste::Match&)>>,std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,std::function<std::shared_ptr<trieste::NodeDef>(trieste::Match&)>>>>>>
      ::
      modify_all<trieste::PassDef::compile_rules()::_lambda(trieste::detail::DefaultMap<std::vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,std::function<std::shared_ptr<trieste::NodeDef>(trieste::Match&)>>,std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,std::function<std::shared_ptr<trieste::NodeDef>(trieste::Match&)>>>>>&)_1_>
                ((DefaultMap<trieste::detail::DefaultMap<std::vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,std::function<std::shared_ptr<trieste::NodeDef>(trieste::Match&)>>,std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,std::function<std::shared_ptr<trieste::NodeDef>(trieste::Match&)>>>>>>
                  *)this_00,f);
    }
    else {
      for (p_Var2 = *(_Base_ptr *)
                     ((long)&(ppVar3->first).value.fast_pattern.parents._M_t._M_impl.
                             super__Rb_tree_header + 0x10);
          p_Var2 != &(ppVar3->first).value.fast_pattern.parents._M_t._M_impl.super__Rb_tree_header.
                     _M_header;
          p_Var2 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var2)) {
        rules = detail::
                DefaultMap<trieste::detail::DefaultMap<std::vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>_>_>
                ::modify(this_00,(Token *)(p_Var2 + 1));
        compile_rules::anon_class_16_2_a97d8124::operator()(&local_40,rules);
      }
    }
  }
  return;
}

Assistant:

void compile_rules()
    {
      rule_map.clear();

      for (auto& rule : rules_)
      {
        const auto& starts = rule.first.value.get_starts();
        const auto& parents = rule.first.value.get_parents();

        //  This is used to add a rule under a specific parent, or to the
        //  default.
        auto add = [&](detail::DefaultMap<
                       std::vector<detail::PatternEffect<Node>>>& rules) {
          if (starts.empty())
          {
            // If there are no starts, then this rule applies to all tokens.
            rules.modify_all([&](std::vector<detail::PatternEffect<Node>>& v) {
              v.push_back(rule);
            });
          }
          else
          {
            for (const auto& start : starts)
            {
              // Add the rule to the specific start token.
              rules.modify(start).push_back(rule);
            }
          }
        };

        if (parents.empty())
        {
          rule_map.modify_all(add);
        }
        else
        {
          for (const auto& parent : parents)
          {
            add(rule_map.modify(parent));
          }
        }
      }
    }